

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_xfrm.c
# Opt level: O0

void easm_cfold_sinsn(easm_sinsn *sinsn)

{
  int local_18;
  int local_14;
  int j;
  int i;
  easm_sinsn *sinsn_local;
  
  for (local_14 = 0; local_14 < sinsn->operandsnum; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < sinsn->operands[local_14]->exprsnum; local_18 = local_18 + 1) {
      easm_cfold_expr(sinsn->operands[local_14]->exprs[local_18]);
    }
  }
  return;
}

Assistant:

void easm_cfold_sinsn(struct easm_sinsn *sinsn) {
	int i, j;
	for (i = 0; i < sinsn->operandsnum; i++)
		for (j = 0; j < sinsn->operands[i]->exprsnum; j++)
			easm_cfold_expr(sinsn->operands[i]->exprs[j]);
}